

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

void Pdr_QueuePush(Pdr_Man_t *p,Pdr_Obl_t *pObl)

{
  int iVar1;
  Pdr_Obl_t **local_28;
  Pdr_Obl_t **ppPrev;
  Pdr_Obl_t *pTemp;
  Pdr_Obl_t *pObl_local;
  Pdr_Man_t *p_local;
  
  p->nObligs = p->nObligs + 1;
  p->nQueCur = p->nQueCur + 1;
  iVar1 = Abc_MaxInt(p->nQueMax,p->nQueCur);
  p->nQueMax = iVar1;
  Pdr_OblRef(pObl);
  if (p->pQueue == (Pdr_Obl_t *)0x0) {
    p->pQueue = pObl;
  }
  else {
    local_28 = &p->pQueue;
    for (ppPrev = (Pdr_Obl_t **)p->pQueue;
        ((ppPrev != (Pdr_Obl_t **)0x0 && (*(int *)ppPrev <= pObl->iFrame)) &&
        ((*(int *)ppPrev != pObl->iFrame || (*(int *)((long)ppPrev + 4) <= pObl->prio))));
        ppPrev = (Pdr_Obl_t **)ppPrev[4]) {
      local_28 = ppPrev + 4;
    }
    *local_28 = pObl;
    pObl->pLink = (Pdr_Obl_t *)ppPrev;
  }
  return;
}

Assistant:

void Pdr_QueuePush( Pdr_Man_t * p, Pdr_Obl_t * pObl )
{
    Pdr_Obl_t * pTemp, ** ppPrev;
    p->nObligs++;
    p->nQueCur++;
    p->nQueMax = Abc_MaxInt( p->nQueMax, p->nQueCur );
    Pdr_OblRef( pObl );
    if ( p->pQueue == NULL )
    {
        p->pQueue = pObl;
        return;
    }
    for ( ppPrev = &p->pQueue, pTemp = p->pQueue; pTemp; ppPrev = &pTemp->pLink, pTemp = pTemp->pLink )
        if ( pTemp->iFrame > pObl->iFrame || (pTemp->iFrame == pObl->iFrame && pTemp->prio > pObl->prio) )
            break;
    *ppPrev = pObl;
    pObl->pLink = pTemp;
}